

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O2

void __thiscall
QtMWidgets::BusyIndicatorPrivate::BusyIndicatorPrivate
          (BusyIndicatorPrivate *this,BusyIndicator *parent)

{
  this->q = parent;
  this->outerRadius = 10;
  this->innerRadius = 6;
  (this->size).wd = 0x14;
  (this->size).ht = 0x14;
  this->running = true;
  this->animation = (QVariantAnimation *)0x0;
  (this->color).cspec = Invalid;
  (this->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->color).ct + 2) = 0;
  return;
}

Assistant:

BusyIndicatorPrivate( BusyIndicator * parent )
		:	q( parent )
		,	outerRadius( 10 )
		,	innerRadius( outerRadius * 0.6 )
		,	size( outerRadius * 2, outerRadius * 2 )
		,	running( true )
		,	animation( 0 )
	{
	}